

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase154::run(TestCase154 *this)

{
  Reader reader;
  Reader reader_00;
  int iVar1;
  PointerType PVar2;
  SegmentBuilder *pSVar3;
  Reader value;
  Builder root;
  MallocMessageBuilder builder;
  PointerReader local_1e8;
  Builder local_1c0;
  StructBuilder local_1a8;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined6 uStack_160;
  undefined2 uStack_15a;
  undefined6 uStack_158;
  undefined4 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined6 uStack_130;
  undefined2 uStack_12a;
  undefined6 uStack_128;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee8 [40];
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&stack0xfffffffffffffef0,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_1c0,(MessageBuilder *)&stack0xfffffffffffffef0);
  local_1e8.pointer = local_1c0.builder.pointer;
  local_1e8.segment = &(local_1c0.builder.segment)->super_SegmentReader;
  local_1e8.capTable = &(local_1c0.builder.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            (&local_1a8,(PointerBuilder *)&local_1e8,(StructSize)0x140006,(word *)0x0);
  *(undefined4 *)((long)local_1a8.data + 0x14) = 0x7b;
  *(undefined8 *)((long)local_1a8.data + 0x28) = 0x3ff8000000000000;
  local_1e8.segment = &(local_1a8.segment)->super_SegmentReader;
  local_1e8.capTable = &(local_1a8.capTable)->super_CapTableReader;
  local_1e8.pointer = local_1a8.pointers;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1e8,value);
  if (local_1a8.dataSize < 0xc0) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_001beaa3;
    iVar1 = 0;
LAB_001be9fd:
    local_1e8.segment = (SegmentReader *)CONCAT44(local_1e8.segment._4_4_,0x7b);
    local_1c0.builder.segment = (SegmentBuilder *)CONCAT44(local_1c0.builder.segment._4_4_,iVar1);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"(123) == (copy.getUInt32Field())\", 123, copy.getUInt32Field()"
               ,(char (*) [50])"failed: expected (123) == (copy.getUInt32Field())",(int *)&local_1e8
               ,(uint *)&local_1c0);
  }
  else {
    iVar1 = *(int *)((long)local_1a8.data + 0x14);
    if ((iVar1 != 0x7b) && (kj::_::Debug::minSeverity < 3)) goto LAB_001be9fd;
  }
  if (local_1a8.dataSize < 0x180) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_001beaa3;
    pSVar3 = (SegmentBuilder *)0x0;
  }
  else {
    pSVar3 = *(SegmentBuilder **)((long)local_1a8.data + 0x28);
    if ((((double)pSVar3 == 1.5) && (!NAN((double)pSVar3))) || (2 < kj::_::Debug::minSeverity))
    goto LAB_001beaa3;
  }
  local_1e8.segment = (SegmentReader *)0x3ff8000000000000;
  local_1c0.builder.segment = pSVar3;
  kj::_::Debug::log<char_const(&)[51],double,double>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
             ,0xa4,ERROR,
             "\"failed: expected \" \"(1.5) == (copy.getFloat64Field())\", 1.5, copy.getFloat64Field()"
             ,(char (*) [51])"failed: expected (1.5) == (copy.getFloat64Field())",
             (double *)&local_1e8,(double *)&local_1c0);
LAB_001beaa3:
  local_1e8.segment = (SegmentReader *)0x0;
  local_1e8.capTable = (CapTableReader *)0x0;
  local_1e8.pointer = (WirePointer *)0x0;
  local_1e8.nestingLimit = 0x7fffffff;
  PVar2 = PointerReader::getPointerType(&local_1e8);
  if ((PVar2 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0xa5,ERROR,"\"failed: expected \" \"!(copy.hasTextField())\"",
               (char (*) [40])"failed: expected !(copy.hasTextField())");
  }
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_12a = 0;
  uStack_128 = 0;
  uVar4 = 0x7fffffff;
  reader._reader.segment._4_4_ = in_stack_fffffffffffffee4;
  reader._reader.segment._0_4_ = 0x7fffffff;
  reader._reader.capTable = (CapTableReader *)in_stack_fffffffffffffee8._0_8_;
  reader._reader.data = (void *)in_stack_fffffffffffffee8._8_8_;
  reader._reader.pointers = (WirePointer *)in_stack_fffffffffffffee8._16_8_;
  reader._reader.dataSize = in_stack_fffffffffffffee8._24_4_;
  reader._reader.pointerCount = in_stack_fffffffffffffee8._28_2_;
  reader._reader._38_2_ = in_stack_fffffffffffffee8._30_2_;
  reader._reader.nestingLimit = in_stack_fffffffffffffee8._32_4_;
  reader._reader._44_4_ = in_stack_fffffffffffffee8._36_4_;
  checkTestMessageAllZero(reader);
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_15a = 0;
  uStack_158 = 0;
  uStack_150 = 0x7fffffff;
  reader_00._reader.segment._4_4_ = in_stack_fffffffffffffee4;
  reader_00._reader.segment._0_4_ = uVar4;
  reader_00._reader.capTable = (CapTableReader *)in_stack_fffffffffffffee8._0_8_;
  reader_00._reader.data = (void *)in_stack_fffffffffffffee8._8_8_;
  reader_00._reader.pointers = (WirePointer *)in_stack_fffffffffffffee8._16_8_;
  reader_00._reader.dataSize = in_stack_fffffffffffffee8._24_4_;
  reader_00._reader.pointerCount = in_stack_fffffffffffffee8._28_2_;
  reader_00._reader._38_2_ = in_stack_fffffffffffffee8._30_2_;
  reader_00._reader.nestingLimit = in_stack_fffffffffffffee8._32_4_;
  reader_00._reader._44_4_ = in_stack_fffffffffffffee8._36_4_;
  checkTestMessageAllZero(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&stack0xfffffffffffffef0);
  return;
}

Assistant:

TEST(Message, ReadWriteDataStruct) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();

  root.setUInt32Field(123);
  root.setFloat64Field(1.5);
  root.setTextField("foo");

  auto copy = readDataStruct<TestAllTypes>(writeDataStruct(root));
  EXPECT_EQ(123, copy.getUInt32Field());
  EXPECT_EQ(1.5, copy.getFloat64Field());
  EXPECT_FALSE(copy.hasTextField());

  checkTestMessageAllZero(readDataStruct<TestAllTypes>(nullptr));
  checkTestMessageAllZero(defaultValue<TestAllTypes>());
}